

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O2

void __thiscall
helics::CommsBroker<helics::zeromq::ZmqComms,_helics::CommonCore>::~CommsBroker
          (CommsBroker<helics::zeromq::ZmqComms,_helics::CommonCore> *this)

{
  undefined1 *puVar1;
  int iVar2;
  rep in_RAX;
  int iVar3;
  bool bVar4;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  (this->super_CommonCore).super_Core._vptr_Core = (_func_int **)&PTR__CommsBroker_004528e0;
  (this->super_CommonCore).super_BrokerBase._vptr_BrokerBase =
       (_func_int **)&PTR__CommsBroker_00452c78;
  LOCK();
  (this->super_CommonCore).super_BrokerBase.haltOperations._M_base._M_i = true;
  UNLOCK();
  local_38.__r = in_RAX;
  iVar3 = 2;
  while( true ) {
    puVar1 = &(this->super_CommonCore).field_0xd84;
    LOCK();
    iVar2 = *(int *)puVar1;
    bVar4 = iVar3 == iVar2;
    if (bVar4) {
      *(undefined4 *)puVar1 = 3;
      iVar2 = iVar3;
    }
    UNLOCK();
    if (bVar4) break;
    if (iVar2 == 0) {
      commDisconnect(this);
      iVar3 = 1;
    }
    else {
      local_38.__r = 0x32;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
      iVar3 = iVar2;
    }
  }
  std::__uniq_ptr_impl<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>::
  reset((__uniq_ptr_impl<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_> *
        )&this->comms,(pointer)0x0);
  BrokerBase::joinAllThreads(&(this->super_CommonCore).super_BrokerBase);
  std::unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>::
  ~unique_ptr(&this->comms);
  CommonCore::~CommonCore(&this->super_CommonCore);
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::~CommsBroker()
{
    BrokerBase::haltOperations = true;
    int exp = 2;
    while (!disconnectionStage.compare_exchange_weak(exp, 3)) {
        if (exp == 0) {
            commDisconnect();
            exp = 1;
        } else {
            std::this_thread::sleep_for(std::chrono::milliseconds(50));
        }
    }
    comms = nullptr;  // need to ensure the comms are deleted before the callbacks become invalid
    BrokerBase::joinAllThreads();
}